

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
detail::writer::operator()
          (writer *this,vector<example::option_t,_std::allocator<example::option_t>_> *vals)

{
  pointer poVar1;
  option_t *val;
  pointer val_00;
  unsigned_short local_1a;
  
  local_1a = (unsigned_short)
             (((long)(vals->
                     super__Vector_base<example::option_t,_std::allocator<example::option_t>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(vals->super__Vector_base<example::option_t,_std::allocator<example::option_t>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x38);
  operator()(this,&local_1a);
  poVar1 = (vals->super__Vector_base<example::option_t,_std::allocator<example::option_t>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (val_00 = (vals->super__Vector_base<example::option_t,_std::allocator<example::option_t>_>).
                _M_impl.super__Vector_impl_data._M_start; val_00 != poVar1; val_00 = val_00 + 1) {
    operator()(this,val_00);
  }
  return;
}

Assistant:

void operator()(std::vector<T> const& vals) const {
        (*this)(static_cast<uint16_t>(vals.size()));
        for (auto&& val : vals)
            (*this)(val);
    }